

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O0

string * readReferenceFile(string *referencePath)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_RSI;
  string *in_RDI;
  string line;
  ifstream input;
  string *reference;
  locale *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  locale local_260 [15];
  allocator local_251;
  string local_250 [32];
  istream local_230 [542];
  allocator local_12;
  byte local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::ifstream::ifstream(local_230,in_RSI,8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"",&local_251);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::ios::good();
  while( true ) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_230,local_250);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) break;
    uVar2 = std::__cxx11::string::empty();
    if ((((uVar2 & 1) == 0) &&
        (in_stack_fffffffffffffd58 = (locale *)std::__cxx11::string::operator[]((ulong)local_250),
        *in_stack_fffffffffffffd58 != (locale)0x3e)) &&
       ((uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0 ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_250), *pcVar3 != '>')))) {
      std::__cxx11::string::operator+=(in_RDI,local_250);
      std::__cxx11::string::operator=(local_250,"");
    }
  }
  std::locale::locale(local_260);
  boost::algorithm::to_upper<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58);
  std::locale::~locale(local_260);
  local_11 = 1;
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(local_230);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

static string readReferenceFile(std::string referencePath){
    //std::vector<string> reference;
    std::string reference = "";
    std::ifstream input(referencePath);
    std::string line="";
    if(!input.good()){
            //std::cerr << "Error opening "<<reference_path<< "  . Could Not Open Reference File." << std::endl;
            //return reference;
    }
    while( std::getline( input, line ).good() ){
        if( line.empty() || line[0] == '>' ){ // Identifier marker
            continue;
        }else if(!line.empty() || line[0] != '>'){
            reference+=line;
            line = "";
        }
    }
    boost::algorithm::to_upper(reference);
    return reference;
}